

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer.c
# Opt level: O0

CURLcode Curl_xfer_write_resp(Curl_easy *data,char *buf,size_t blen,_Bool is_eos)

{
  int local_2c;
  CURLcode local_28;
  int cwtype;
  CURLcode result;
  _Bool is_eos_local;
  size_t blen_local;
  char *buf_local;
  Curl_easy *data_local;
  
  local_28 = CURLE_OK;
  if (data->conn->handler->write_resp == (_func_CURLcode_Curl_easy_ptr_char_ptr_size_t__Bool *)0x0)
  {
    if ((blen != 0) || (is_eos)) {
      local_2c = 1;
      if (is_eos) {
        local_2c = 0x81;
      }
      local_28 = Curl_client_write(data,local_2c,buf,blen);
    }
  }
  else {
    local_28 = (*data->conn->handler->write_resp)(data,buf,blen,is_eos);
  }
  if ((local_28 == CURLE_OK) && (is_eos)) {
    *(uint *)&(data->req).field_0xd9 = *(uint *)&(data->req).field_0xd9 & 0xffffffef | 0x10;
    *(uint *)&(data->req).field_0xd9 = *(uint *)&(data->req).field_0xd9 & 0xfffffff7 | 8;
  }
  if ((((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ca >> 0x1c & 1) != 0)) &&
      (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)))) &&
     (0 < Curl_trc_feat_write.log_level)) {
    Curl_trc_write(data,"xfer_write_resp(len=%zu, eos=%d) -> %d",blen,(ulong)is_eos,(ulong)local_28)
    ;
  }
  return local_28;
}

Assistant:

CURLcode Curl_xfer_write_resp(struct Curl_easy *data,
                              const char *buf, size_t blen,
                              bool is_eos)
{
  CURLcode result = CURLE_OK;

  if(data->conn->handler->write_resp) {
    /* protocol handlers offering this function take full responsibility
     * for writing all received download data to the client. */
    result = data->conn->handler->write_resp(data, buf, blen, is_eos);
  }
  else {
    /* No special handling by protocol handler, write all received data
     * as BODY to the client. */
    if(blen || is_eos) {
      int cwtype = CLIENTWRITE_BODY;
      if(is_eos)
        cwtype |= CLIENTWRITE_EOS;
      result = Curl_client_write(data, cwtype, buf, blen);
    }
  }

  if(!result && is_eos) {
    /* If we wrote the EOS, we are definitely done */
    data->req.eos_written = TRUE;
    data->req.download_done = TRUE;
  }
  CURL_TRC_WRITE(data, "xfer_write_resp(len=%zu, eos=%d) -> %d",
                 blen, is_eos, result);
  return result;
}